

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O1

void import_append_char(ImportCtx *p,int c)

{
  int iVar1;
  char *pcVar2;
  idx_t nArg;
  char **azArg;
  ShellState *this;
  
  if (p->nAlloc <= p->n + 1) {
    iVar1 = p->nAlloc * 2 + 100;
    p->nAlloc = iVar1;
    this = (ShellState *)p->z;
    azArg = (char **)(long)iVar1;
    pcVar2 = (char *)duckdb_shell_sqlite3_realloc64(this,(sqlite3_uint64)azArg);
    p->z = pcVar2;
    if (pcVar2 == (char *)0x0) {
      import_append_char();
      duckdb_shell::ShellState::ImportData(this,azArg,nArg);
      return;
    }
  }
  iVar1 = p->n;
  p->n = iVar1 + 1;
  p->z[iVar1] = (char)c;
  return;
}

Assistant:

static void import_append_char(ImportCtx *p, int c) {
	if (p->n + 1 >= p->nAlloc) {
		p->nAlloc += p->nAlloc + 100;
		p->z = (char *)sqlite3_realloc64(p->z, p->nAlloc);
		if (p->z == 0)
			shell_out_of_memory();
	}
	p->z[p->n++] = (char)c;
}